

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hal_jpege_vepu2_v2.c
# Opt level: O0

MPP_RET hal_jpege_vepu2_ret_task(void *hal,HalEncTask *task)

{
  EncRcTask *pEVar1;
  EncRcTaskInfo *rc_info;
  HalJpegeCtx *ctx;
  HalEncTask *task_local;
  void *hal_local;
  
  pEVar1 = task->rc_task;
  *(RK_S32 *)((long)hal + 0x148) = (task->rc_task->info).quality_target;
  (task->rc_task->info).bit_real = *(int *)((long)hal + 0xfc) << 3;
  (task->hal_ret).data = (void *)((long)hal + 0xf8);
  (task->hal_ret).number = 1;
  if (*(int *)(*(long *)((long)hal + 0x38) + 0x94) == 2) {
    (pEVar1->info).quality_real = *(RK_S32 *)(*(long *)((long)hal + 0x38) + 0x350);
  }
  else if (*(int *)((long)hal + 0x130) == 0) {
    (pEVar1->info).quality_real = (pEVar1->info).quality_target;
  }
  else {
    (pEVar1->info).quality_real = *(RK_S32 *)((long)hal + 0x130);
  }
  return MPP_OK;
}

Assistant:

MPP_RET hal_jpege_vepu2_ret_task(void *hal, HalEncTask *task)
{
    HalJpegeCtx *ctx = (HalJpegeCtx *)hal;
    EncRcTaskInfo *rc_info = &task->rc_task->info;

    ctx->hal_rc.last_quality = task->rc_task->info.quality_target;
    task->rc_task->info.bit_real = ctx->feedback.stream_length * 8;
    task->hal_ret.data = &ctx->feedback;
    task->hal_ret.number = 1;

    if (ctx->cfg->rc.rc_mode != MPP_ENC_RC_MODE_FIXQP) {
        if (!ctx->hal_rc.q_factor)
            rc_info->quality_real = rc_info->quality_target;
        else
            rc_info->quality_real = ctx->hal_rc.q_factor;
    } else {
        rc_info->quality_real = ctx->cfg->codec.jpeg.q_factor;
    }

    return MPP_OK;
}